

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

uint32_t __thiscall
diligent_spirv_cross::CompilerGLSL::get_integer_width_for_instruction
          (CompilerGLSL *this,Instruction *instr)

{
  ushort uVar1;
  Variant *pVVar2;
  uint32_t *puVar3;
  SPIRType *pSVar4;
  ulong uVar5;
  uint32_t uVar6;
  
  uVar6 = 0x20;
  if (2 < instr->length) {
    puVar3 = Compiler::stream(&this->super_Compiler,instr);
    uVar1 = instr->op;
    if ((uVar1 - 0xaa < 10) || (uVar1 - 0x6f < 4)) {
      pSVar4 = Compiler::expression_type(&this->super_Compiler,puVar3[2]);
    }
    else if (uVar1 - 0x97 < 2) {
      pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.
                          super_VectorView<diligent_spirv_cross::Variant>.ptr + *puVar3);
      pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.
                          super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          ((pSVar4->member_types).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          .ptr)->id);
    }
    else {
      uVar5 = (ulong)*puVar3;
      if ((this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size
          <= uVar5) {
        return 0x20;
      }
      pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
      if (pVVar2[uVar5].type != TypeType) {
        return 0x20;
      }
      pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>(pVVar2 + uVar5);
      if (7 < pSVar4->basetype - SByte) {
        return 0x20;
      }
    }
    uVar6 = pSVar4->width;
  }
  return uVar6;
}

Assistant:

uint32_t CompilerGLSL::get_integer_width_for_instruction(const Instruction &instr) const
{
	if (instr.length < 3)
		return 32;

	auto *ops = stream(instr);

	switch (instr.op)
	{
	case OpSConvert:
	case OpConvertSToF:
	case OpUConvert:
	case OpConvertUToF:
	case OpIEqual:
	case OpINotEqual:
	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
		return expression_type(ops[2]).width;

	case OpSMulExtended:
	case OpUMulExtended:
		return get<SPIRType>(get<SPIRType>(ops[0]).member_types[0]).width;

	default:
	{
		// We can look at result type which is more robust.
		auto *type = maybe_get<SPIRType>(ops[0]);
		if (type && type_is_integral(*type))
			return type->width;
		else
			return 32;
	}
	}
}